

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int geopolyBestIndex(sqlite3_vtab *tab,sqlite3_index_info *pIdxInfo)

{
  sqlite3_index_constraint_usage *psVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  uchar *puVar6;
  ulong uVar7;
  int iVar8;
  bool bVar9;
  
  if ((long)pIdxInfo->nConstraint < 1) {
    iVar8 = 0;
    uVar4 = 0xffffffff;
    uVar2 = 0xffffffff;
  }
  else {
    puVar6 = &pIdxInfo->aConstraint->usable;
    uVar3 = 0xffffffff;
    iVar8 = 0;
    uVar5 = 0xffffffff;
    uVar7 = 0;
    do {
      if (*puVar6 == '\0') {
LAB_001ff2e2:
        bVar9 = false;
      }
      else if ((((sqlite3_index_constraint *)(puVar6 + -5))->iColumn < 0) && (puVar6[-1] == '\x02'))
      {
        bVar9 = true;
        uVar5 = uVar7 & 0xffffffff;
      }
      else {
        if ((((sqlite3_index_constraint *)(puVar6 + -5))->iColumn != 0) || (puVar6[-1] < 0x96))
        goto LAB_001ff2e2;
        iVar8 = puVar6[-1] - 0x94;
        bVar9 = false;
        uVar3 = uVar7 & 0xffffffff;
      }
      uVar2 = (uint)uVar3;
      uVar4 = (uint)uVar5;
      if (bVar9) break;
      puVar6 = puVar6 + 0xc;
      bVar9 = (long)pIdxInfo->nConstraint - 1U != uVar7;
      uVar7 = uVar7 + 1;
    } while (bVar9);
  }
  if ((int)uVar4 < 0) {
    if ((int)uVar2 < 0) {
      pIdxInfo->idxNum = 4;
      pIdxInfo->idxStr = "fullscan";
      pIdxInfo->estimatedCost = 3000000.0;
      pIdxInfo->estimatedRows = 100000;
    }
    else {
      pIdxInfo->idxNum = iVar8;
      pIdxInfo->idxStr = "rtree";
      psVar1 = pIdxInfo->aConstraintUsage;
      psVar1[uVar2].argvIndex = 1;
      psVar1[uVar2].omit = '\0';
      pIdxInfo->estimatedCost = 300.0;
      pIdxInfo->estimatedRows = 10;
    }
  }
  else {
    pIdxInfo->idxNum = 1;
    pIdxInfo->idxStr = "rowid";
    psVar1 = pIdxInfo->aConstraintUsage;
    psVar1[uVar4].argvIndex = 1;
    psVar1[uVar4].omit = '\x01';
    pIdxInfo->estimatedCost = 30.0;
    pIdxInfo->estimatedRows = 1;
    pIdxInfo->idxFlags = 1;
  }
  return 0;
}

Assistant:

static int geopolyBestIndex(sqlite3_vtab *tab, sqlite3_index_info *pIdxInfo){
  int ii;
  int iRowidTerm = -1;
  int iFuncTerm = -1;
  int idxNum = 0;
  (void)tab;

  for(ii=0; ii<pIdxInfo->nConstraint; ii++){
    struct sqlite3_index_constraint *p = &pIdxInfo->aConstraint[ii];
    if( !p->usable ) continue;
    if( p->iColumn<0 && p->op==SQLITE_INDEX_CONSTRAINT_EQ  ){
      iRowidTerm = ii;
      break;
    }
    if( p->iColumn==0 && p->op>=SQLITE_INDEX_CONSTRAINT_FUNCTION ){
      /* p->op==SQLITE_INDEX_CONSTRAINT_FUNCTION for geopoly_overlap()
      ** p->op==(SQLITE_INDEX_CONTRAINT_FUNCTION+1) for geopoly_within().
      ** See geopolyFindFunction() */
      iFuncTerm = ii;
      idxNum = p->op - SQLITE_INDEX_CONSTRAINT_FUNCTION + 2;
    }
  }

  if( iRowidTerm>=0 ){
    pIdxInfo->idxNum = 1;
    pIdxInfo->idxStr = "rowid";
    pIdxInfo->aConstraintUsage[iRowidTerm].argvIndex = 1;
    pIdxInfo->aConstraintUsage[iRowidTerm].omit = 1;
    pIdxInfo->estimatedCost = 30.0;
    pIdxInfo->estimatedRows = 1;
    pIdxInfo->idxFlags = SQLITE_INDEX_SCAN_UNIQUE;
    return SQLITE_OK;
  }
  if( iFuncTerm>=0 ){
    pIdxInfo->idxNum = idxNum;
    pIdxInfo->idxStr = "rtree";
    pIdxInfo->aConstraintUsage[iFuncTerm].argvIndex = 1;
    pIdxInfo->aConstraintUsage[iFuncTerm].omit = 0;
    pIdxInfo->estimatedCost = 300.0;
    pIdxInfo->estimatedRows = 10;
    return SQLITE_OK;
  }
  pIdxInfo->idxNum = 4;
  pIdxInfo->idxStr = "fullscan";
  pIdxInfo->estimatedCost = 3000000.0;
  pIdxInfo->estimatedRows = 100000;
  return SQLITE_OK;
}